

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readChunk_PLTE(LodePNGColorMode *color,uchar *data,size_t chunkLength)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  color->palettesize = chunkLength / 3;
  if (chunkLength - 0x303 < 0xfffffffffffffd00) {
    uVar1 = 0x26;
  }
  else {
    lodepng_color_mode_alloc_palette(color);
    if ((color->palette == (uchar *)0x0) && (color->palettesize != 0)) {
      color->palettesize = 0;
      uVar1 = 0x53;
    }
    else {
      uVar1 = 0;
      uVar2 = 2;
      uVar3 = 3;
      for (uVar4 = 0; color->palettesize != (ulong)uVar4; uVar4 = uVar4 + 1) {
        color->palette[uVar3 - 3] = data[uVar2 - 2];
        color->palette[uVar3 - 2] = data[uVar2 - 1];
        color->palette[uVar3 - 1] = data[uVar2];
        color->palette[uVar3] = 0xff;
        uVar2 = uVar2 + 3;
        uVar3 = uVar3 + 4;
      }
    }
  }
  return uVar1;
}

Assistant:

static unsigned readChunk_PLTE(LodePNGColorMode* color, const unsigned char* data, size_t chunkLength) {
  unsigned pos = 0, i;
  color->palettesize = chunkLength / 3u;
  if (color->palettesize == 0 || color->palettesize > 256) return 38; /*error: palette too small or big*/
  lodepng_color_mode_alloc_palette(color);
  if (!color->palette && color->palettesize) {
    color->palettesize = 0;
    return 83; /*alloc fail*/
  }

  for (i = 0; i != color->palettesize; ++i) {
    color->palette[4 * i + 0] = data[pos++]; /*R*/
    color->palette[4 * i + 1] = data[pos++]; /*G*/
    color->palette[4 * i + 2] = data[pos++]; /*B*/
    color->palette[4 * i + 3] = 255; /*alpha*/
  }

  return 0; /* OK */
}